

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *
llvm::cl::getRegisteredOptions(SubCommand *Sub)

{
  bool bVar1;
  CommandLineParser *pCVar2;
  SubCommand *local_10;
  
  pCVar2 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                         *)Sub);
  local_10 = Sub;
  bVar1 = is_contained<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&,llvm::cl::SubCommand*>
                    (&pCVar2->RegisteredSubCommands,&local_10);
  if (bVar1) {
    return &Sub->OptionsMap;
  }
  __assert_fail("is_contained(Subs, &Sub)",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                ,0x89a,"StringMap<Option *> &llvm::cl::getRegisteredOptions(SubCommand &)");
}

Assistant:

StringMap<Option *> &cl::getRegisteredOptions(SubCommand &Sub) {
  auto &Subs = GlobalParser->RegisteredSubCommands;
  (void)Subs;
  assert(is_contained(Subs, &Sub));
  return Sub.OptionsMap;
}